

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O0

void __thiscall glslang::TInfoSinkBase::prefix(TInfoSinkBase *this,TPrefixType message)

{
  TPrefixType message_local;
  TInfoSinkBase *this_local;
  
  switch(message) {
  case EPrefixNone:
    break;
  case EPrefixWarning:
    append(this,"WARNING: ");
    break;
  case EPrefixError:
    append(this,"ERROR: ");
    break;
  case EPrefixInternalError:
    append(this,"INTERNAL ERROR: ");
    break;
  case EPrefixUnimplemented:
    append(this,"UNIMPLEMENTED: ");
    break;
  case EPrefixNote:
    append(this,"NOTE: ");
    break;
  default:
    append(this,"UNKNOWN ERROR: ");
  }
  return;
}

Assistant:

void prefix(TPrefixType message) {
        switch(message) {
        case EPrefixNone:                                      break;
        case EPrefixWarning:       append("WARNING: ");        break;
        case EPrefixError:         append("ERROR: ");          break;
        case EPrefixInternalError: append("INTERNAL ERROR: "); break;
        case EPrefixUnimplemented: append("UNIMPLEMENTED: ");  break;
        case EPrefixNote:          append("NOTE: ");           break;
        default:                   append("UNKNOWN ERROR: ");   break;
        }
    }